

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void Function_Pool::Threshold
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t minThreshold,
               uint8_t maxThreshold)

{
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  uint32_t in_stack_fffffffffffffe84;
  Image *in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffe90;
  uint32_t in_stack_fffffffffffffe94;
  Image *in_stack_fffffffffffffe98;
  FunctionTask *in_stack_fffffffffffffea0;
  uint32_t in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffec0;
  uint8_t in_stack_fffffffffffffec8;
  uint8_t in_stack_fffffffffffffed0;
  
  FunctionTask::FunctionTask
            ((FunctionTask *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  FunctionTask::Threshold
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
  FunctionTask::~FunctionTask((FunctionTask *)CONCAT44(in_stack_fffffffffffffe54,in_stack_00000008))
  ;
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t minThreshold, uint8_t maxThreshold )
    {
        FunctionTask().Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, minThreshold, maxThreshold );
    }